

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_struct::dump(statement_struct *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  ostream *poVar2;
  statement_base **ptr;
  _Elt_pointer ppsVar3;
  _Elt_pointer ppsVar4;
  _Map_pointer pppsVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< BeginStruct: ID = \"",0x15);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(this->mName)._M_dataplus._M_p,(this->mName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  if ((this->mParent).mRoot != (tree_node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(o,", Parent = ",0xb);
    compiler_type::dump_expr((this->mParent).mRoot,o);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o," >\n",3);
  ppsVar3 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar3 != ppsVar1) {
    ppsVar4 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar5 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar3)->_vptr_statement_base[5])(*ppsVar3,o);
      ppsVar3 = ppsVar3 + 1;
      if (ppsVar3 == ppsVar4) {
        ppsVar3 = pppsVar5[1];
        pppsVar5 = pppsVar5 + 1;
        ppsVar4 = ppsVar3 + 0x40;
      }
    } while (ppsVar3 != ppsVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< EndStruct >\n",0xe);
  return;
}

Assistant:

void statement_struct::dump(std::ostream &o) const
	{
		o << "< BeginStruct: ID = \"" << mName << "\"";
		if (mParent.root().usable()) {
			o << ", Parent = ";
			compiler_type::dump_expr(mParent.root(), o);
		}
		o << " >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndStruct >\n";
	}